

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRandom.cpp
# Opt level: O2

void anon_unknown.dwarf_d7401::testGenerator<Imath_3_2::Rand48>(void)

{
  uint uVar1;
  int i;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  double dVar13;
  Rand48 rand;
  int values [11];
  int diffs [23];
  
  for (lVar3 = 0; lVar3 != 0xb; lVar3 = lVar3 + 1) {
    values[lVar3] = 0;
  }
  for (lVar3 = 2; lVar3 != 0x17; lVar3 = lVar3 + 1) {
    diffs[lVar3] = 0;
  }
  rand._state[0] = 0x5a5a;
  rand._state[1] = 0x5a5a;
  rand._state[2] = 0x5a5a;
  iVar6 = 1000000;
  fVar8 = 0.0;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    dVar9 = (double)Imath_3_2::erand48(rand._state);
    fVar12 = (float)((1.0 - dVar9) * 0.0 + dVar9);
    values[(int)(fVar12 * 10.0)] = values[(int)(fVar12 * 10.0)] + 1;
    iVar2 = Imath_3_2::floor<double>((double)((fVar12 - fVar8) * 10.0) + 0.5);
    diffs[(long)iVar2 + 0xc] = diffs[(long)iVar2 + 0xc] + 1;
    fVar8 = fVar12;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"  values");
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar3 = 0;
  while (lVar3 != 10) {
    uVar5 = values[lVar3] - 100000;
    uVar1 = -uVar5;
    if (0 < (int)uVar5) {
      uVar1 = uVar5;
    }
    lVar3 = lVar3 + 1;
    if (999 < uVar1) {
      __assert_fail("abs (v[i] - M) < 0.01 * M",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                    ,0x8f,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]");
    }
  }
  if (values[10] != 0) {
    __assert_fail("v[N] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                  ,0x97,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]");
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"  differences between successive values");
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar3 = 0;
  while (lVar3 != 0x15) {
    iVar2 = (int)lVar3 + -10;
    iVar6 = -iVar2;
    if (iVar2 < 1) {
      iVar6 = iVar2;
    }
    uVar5 = (iVar6 * 10000 - diffs[lVar3 + 2]) + 100000;
    uVar1 = -uVar5;
    if (0 < (int)uVar5) {
      uVar1 = uVar5;
    }
    lVar3 = lVar3 + 1;
    if (4999 < uVar1) {
      __assert_fail("abs ((N - abs (i)) * M / N - d[i]) < 0.05 * M",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                    ,0x9e,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]");
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"  range");
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar6 = 0x989681;
  dVar9 = 0.0;
  dVar13 = 1.0;
  while (dVar11 = dVar9, bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    dVar9 = (double)Imath_3_2::erand48(rand._state);
    dVar9 = (1.0 - dVar9) * 0.0 + dVar9;
    dVar10 = dVar9;
    if (dVar13 <= dVar9) {
      dVar10 = dVar13;
    }
    dVar13 = dVar10;
    if (dVar9 <= dVar11) {
      dVar9 = dVar11;
    }
  }
  if ((dVar13 < 0.0001) && (0.9999 < dVar11)) {
    iVar6 = 0x989682;
    do {
      iVar6 = iVar6 + -1;
      if (iVar6 == 0) {
        return;
      }
      dVar9 = Imath_3_2::Rand48::nextf(&rand,-2.0,3.0);
      if ((dVar9 < -2.0) || (3.0 < dVar9)) {
        __assert_fail("r0 >= -2.0 && r0 <= 3.0",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                      ,0xbb,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]"
                     );
      }
      dVar9 = (double)Imath_3_2::erand48(rand._state);
      dVar9 = (1.0 - dVar9) * -1.152921504606847e+18 + dVar9;
      if ((dVar9 < -1.152921504606847e+18) || (1.0 < dVar9)) {
        __assert_fail("r1 >= -pow_2_60 && r1 <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                      ,0xbe,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]"
                     );
      }
      dVar9 = Imath_3_2::Rand48::nextf(&rand,-1.0,1.152921504606847e+18);
    } while ((-1.0 <= dVar9) && (dVar9 <= 1.152921504606847e+18));
    __assert_fail("r2 >= -1 && r2 <= pow_2_60",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                  ,0xc1,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]");
  }
  __assert_fail("rMin < 0.0001 && rMax > 0.9999",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                ,0xb4,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]");
}

Assistant:

void
testGenerator ()
{
    //
    // Test if the values, and the differences between
    // successive values, are evenly distributed.
    //

    const int N = 10;
    const int M = 100000;

    int  values[N + 1];
    int  diffs[2 * N + 3];
    int* v = &values[0];
    int* d = &diffs[N + 2];

    for (int i = 0; i <= N; ++i)
        v[i] = 0;

    for (int i = -N; i <= N; ++i)
        d[i] = 0;

    Rand  rand (0);
    float previous = 0;

    for (int i = 0; i < M * N; ++i)
    {
        float r    = float(rand.nextf (0.0, 1.0));
        float diff = r - previous;
        previous   = r;

        v[int (r * N)] += 1;
        d[IMATH_INTERNAL_NAMESPACE::floor (diff * N + 0.5)] += 1;
    }

    cout << "  values" << endl;

    for (int i = 0; i < N; ++i)
    {
        // cout << setw (4) << i << ' ' << setw(6) << v[i] << ' ';
        assert (abs (v[i] - M) < 0.01 * M);

        // for (int j = 0; j < v[i] * 60 / M; ++j)
        //      cout << '*';

        // cout << endl;
    }

    assert (v[N] == 0);

    cout << "  differences between successive values" << endl;

    for (int i = -N; i <= N; ++i)
    {
        // cout << setw (4) << i << ' ' << setw (6) << d[i] << ' ';
        assert (abs ((N - abs (i)) * M / N - d[i]) < 0.05 * M);

        // for (int j = 0; j < d[i] * 60 / M; ++j)
        //     cout << '*';

        // cout << endl;
    }

    cout << "  range" << endl;

    double rMin = 1.0;
    double rMax = 0.0;

    for (int i = 0; i <= 10000000; ++i)
    {
        double r = rand.nextf (0.0, 1.0);

        if (rMin > r) rMin = r;

        if (rMax < r) rMax = r;
    }

    assert (rMin < 0.0001 && rMax > 0.9999);

    const double pow_2_60 = double (1073741824) * double (1073741824);

    for (int i = 0; i <= 10000000; ++i)
    {
        double r0 = rand.nextf (-2.0, 3.0);
        assert (r0 >= -2.0 && r0 <= 3.0);

        double r1 = rand.nextf (-pow_2_60, 1);
        assert (r1 >= -pow_2_60 && r1 <= 1);

        double r2 = rand.nextf (-1, pow_2_60);
        assert (r2 >= -1 && r2 <= pow_2_60);
    }
}